

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall httplib::detail::stream_line_reader::end_with_crlf(stream_line_reader *this)

{
  pointer pcVar1;
  ulong uVar2;
  string *psVar3;
  
  uVar2 = (this->glowable_buffer_)._M_string_length;
  psVar3 = &this->glowable_buffer_;
  if (uVar2 == 0) {
    psVar3 = (string *)&this->fixed_buffer_;
  }
  if (uVar2 == 0) {
    uVar2 = this->fixed_buffer_used_size_;
  }
  if ((1 < uVar2) && (pcVar1 = (psVar3->_M_dataplus)._M_p, pcVar1[uVar2 - 2] == '\r')) {
    return pcVar1[uVar2 - 1] == '\n';
  }
  return false;
}

Assistant:

inline const char *stream_line_reader::ptr() const {
  if (glowable_buffer_.empty()) {
    return fixed_buffer_;
  } else {
    return glowable_buffer_.data();
  }
}